

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O2

void reallymarkobject(global_State *g,GCObject *o)

{
  byte bVar1;
  GCObject *pGVar2;
  Udata *iu;
  
  bVar1 = o->marked;
LAB_0011a359:
  bVar1 = bVar1 & 0xfc;
  o->marked = bVar1;
  switch(o->tt) {
  case '\x04':
    o->marked = bVar1 | 4;
    pGVar2 = (GCObject *)(ulong)(byte)o->field_0xb;
    goto LAB_0011a3ee;
  case '\x05':
    o[3].next = g->gray;
    break;
  case '\a':
    goto switchD_0011a373_caseD_7;
  case '\b':
    *(GCObject **)&o[4].tt = g->gray;
    break;
  case '\t':
    o[7].next = g->gray;
    break;
  case '\n':
  case '\v':
  case '\f':
  case '\r':
  case '\x0e':
  case '\x0f':
  case '\x10':
  case '\x11':
  case '\x12':
  case '\x13':
    goto switchD_0011a373_caseD_a;
  case '\x14':
    o->marked = bVar1 | 4;
    pGVar2 = o[1].next;
LAB_0011a3ee:
    g->GCmemtrav = (lu_mem)(&pGVar2[1].marked + g->GCmemtrav);
    return;
  default:
    if (o->tt != '&') {
      return;
    }
  case '\x06':
    o[1].next = g->gray;
  }
  g->gray = o;
  return;
switchD_0011a373_caseD_7:
  pGVar2 = o[1].next;
  if ((pGVar2 != (GCObject *)0x0) && ((pGVar2->marked & 3) != 0)) {
    reallymarkobject(g,pGVar2);
    bVar1 = o->marked;
  }
  o->marked = bVar1 | 4;
  g->GCmemtrav = *(long *)&o[1].tt + g->GCmemtrav + 0x28;
  if ((o->field_0xa & 0x40) == 0) {
    return;
  }
  o = o[2].next;
  bVar1 = o->marked;
  if ((bVar1 & 3) == 0) {
switchD_0011a373_caseD_a:
    return;
  }
  goto LAB_0011a359;
}

Assistant:

static void reallymarkobject (global_State *g, GCObject *o) {
  white2gray(o);
  switch (o->tt) {
    case LUA_VSHRSTR:
    case LUA_VLNGSTR: {
      gray2black(o);
      break;
    }
    case LUA_VUPVAL: {
      UpVal *uv = gco2upv(o);
      if (!upisopen(uv))  /* open upvalues are kept gray */
        gray2black(o);
      markvalue(g, uv->v);  /* mark its content */
      break;
    }
    case LUA_VUSERDATA: {
      Udata *u = gco2u(o);
      if (u->nuvalue == 0) {  /* no user values? */
        markobjectN(g, u->metatable);  /* mark its metatable */
        gray2black(o);  /* nothing else to mark */
        break;
      }
      /* else... */
    }  /* FALLTHROUGH */
    case LUA_VLCL: case LUA_VCCL: case LUA_VTABLE:
    case LUA_VTHREAD: case LUA_VPROTO: {
      linkobjgclist(o, g->gray);
      break;
    }
    default: lua_assert(0); break;
  }
}